

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

NSVGimage * nsvgParse(char *input,char *units,float dpi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined4 uVar5;
  byte bVar6;
  NSVGpath *pNVar7;
  NSVGgradient *pNVar8;
  NSVGgradientData *pNVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  NSVGparser *p;
  NSVGimage *pNVar13;
  NSVGpath **ppNVar14;
  NSVGshape *pNVar15;
  ulong uVar16;
  ulong uVar17;
  NSVGshape *pNVar18;
  NSVGgradientData *__ptr;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float local_a8;
  float fStack_a4;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 auVar26 [16];
  
  p = (NSVGparser *)calloc(1,0x9c60);
  if (p == (NSVGparser *)0x0) {
    return (NSVGimage *)0x0;
  }
  pNVar13 = (NSVGimage *)calloc(1,0x10);
  p->image = pNVar13;
  if (pNVar13 == (NSVGimage *)0x0) {
    free(p);
    return (NSVGimage *)0x0;
  }
  p->attr[0].xform[0] = 1.0;
  p->attr[0].xform[3] = 1.0;
  p->attr[0].opacity = 1.0;
  p->attr[0].fillOpacity = 1.0;
  p->attr[0].strokeOpacity = 1.0;
  p->attr[0].stopOpacity = 1.0;
  p->attr[0].strokeWidth = 1.0;
  p->attr[0].miterLimit = 4.0;
  p->attr[0].hasFill = '\x01';
  p->attr[0].visible = '\x01';
  p->dpi = dpi;
  nsvg__parseXML(input,nsvg__startElement,nsvg__endElement,nsvg__content,p);
  pNVar13 = p->image;
  pNVar18 = pNVar13->shapes;
  if (pNVar18 == (NSVGshape *)0x0) {
    fVar23 = 0.0;
    fVar32 = 0.0;
    fVar25 = 0.0;
    fVar29 = 0.0;
  }
  else {
    fVar23 = pNVar18->bounds[0];
    fVar32 = pNVar18->bounds[1];
    fVar25 = pNVar18->bounds[2];
    fVar29 = pNVar18->bounds[3];
    pNVar15 = pNVar18;
    while (pNVar15 = pNVar15->next, pNVar15 != (NSVGshape *)0x0) {
      uVar19 = -(uint)(fVar23 < pNVar15->bounds[0]);
      uVar20 = -(uint)(fVar32 < pNVar15->bounds[1]);
      uVar21 = -(uint)(pNVar15->bounds[2] < fVar25);
      uVar22 = -(uint)(pNVar15->bounds[3] < fVar29);
      fVar23 = (float)((uint)fVar23 & uVar19 | ~uVar19 & (uint)pNVar15->bounds[0]);
      fVar32 = (float)((uint)fVar32 & uVar20 | ~uVar20 & (uint)pNVar15->bounds[1]);
      fVar25 = (float)((uint)fVar25 & uVar21 | ~uVar21 & (uint)pNVar15->bounds[2]);
      fVar29 = (float)((uint)fVar29 & uVar22 | ~uVar22 & (uint)pNVar15->bounds[3]);
    }
  }
  fVar31 = p->viewWidth;
  fVar33 = 0.0;
  if ((fVar31 == 0.0) && (!NAN(fVar31))) {
    fVar31 = pNVar13->width;
    fVar33 = 0.0;
    if (fVar31 <= 0.0) {
      p->viewMinx = fVar23;
      fVar31 = fVar25 - fVar23;
      fVar33 = fVar29;
    }
    p->viewWidth = fVar31;
  }
  fVar23 = p->viewHeight;
  fVar25 = 0.0;
  if ((fVar23 == 0.0) && (!NAN(fVar23))) {
    fVar23 = pNVar13->height;
    fVar25 = 0.0;
    if (fVar23 <= 0.0) {
      p->viewMiny = fVar32;
      fVar23 = fVar29 - fVar32;
      fVar25 = fVar29;
    }
    p->viewHeight = fVar23;
  }
  fVar32 = pNVar13->width;
  fVar29 = 0.0;
  if ((fVar32 == 0.0) && (!NAN(fVar32))) {
    pNVar13->width = fVar31;
    fVar32 = fVar31;
    fVar29 = fVar33;
  }
  fVar35 = pNVar13->height;
  fVar39 = 0.0;
  if ((fVar35 == 0.0) && (!NAN(fVar35))) {
    pNVar13->height = fVar23;
    fVar35 = fVar23;
    fVar39 = fVar25;
  }
  uVar1 = p->viewMinx;
  uVar4 = p->viewMiny;
  auVar24._4_4_ = fVar33;
  auVar24._0_4_ = fVar31;
  auVar24._8_4_ = fVar33;
  auVar24._12_4_ = fVar25;
  auVar28._8_8_ = auVar24._8_8_;
  auVar28._4_4_ = fVar23;
  auVar28._0_4_ = fVar31;
  auVar27._4_4_ = fVar29;
  auVar27._0_4_ = fVar32;
  auVar27._8_4_ = fVar29;
  auVar27._12_4_ = fVar39;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._4_4_ = fVar35;
  auVar26._0_4_ = fVar32;
  auVar28 = divps(auVar26,auVar28);
  fVar25 = (float)(auVar28._0_4_ & -(uint)(0.0 < fVar31));
  fVar29 = (float)(auVar28._4_4_ & -(uint)(0.0 < fVar23));
  uVar19 = nsvg__parseUnits(units);
  fVar33 = nsvg__convertToPixels(p,(NSVGcoordinate)(((ulong)uVar19 << 0x20) + 0x3f800000),0.0,1.0);
  if (p->alignType == 2) {
    if (fVar25 <= fVar29) {
      fVar25 = fVar29;
    }
    fVar39 = 0.0;
    if (p->alignX != 0) {
      if (p->alignX == 2) {
        fVar39 = fVar32 - fVar31 * fVar25;
      }
      else {
        fVar39 = (fVar32 - fVar31 * fVar25) * 0.5;
      }
    }
    fVar39 = fVar39 / fVar25;
    if (p->alignY == 0) {
      fVar35 = 0.0;
    }
    else {
      fVar35 = fVar35 - fVar23 * fVar25;
      if (p->alignY != 2) {
        fVar35 = fVar35 * 0.5;
      }
    }
    fVar34 = fVar35 / fVar25;
  }
  else {
    if (p->alignType != 1) {
      fVar39 = -(float)uVar1;
      fVar34 = -(float)uVar4;
      goto LAB_0014b49e;
    }
    if (fVar29 <= fVar25) {
      fVar25 = fVar29;
    }
    fVar34 = 0.0;
    fVar39 = 0.0;
    if (p->alignX != 0) {
      if (p->alignX == 2) {
        fVar39 = fVar32 - fVar31 * fVar25;
      }
      else {
        fVar39 = (fVar32 - fVar31 * fVar25) * 0.5;
      }
    }
    fVar39 = fVar39 / fVar25;
    if ((p->alignY != 0) && (fVar34 = fVar35 - fVar23 * fVar25, p->alignY != 2)) {
      fVar34 = fVar34 * 0.5;
    }
    fVar34 = fVar34 / fVar25;
  }
  fVar39 = fVar39 - (float)uVar1;
  fVar34 = fVar34 - (float)uVar4;
  fVar29 = fVar25;
LAB_0014b49e:
  fVar25 = (1.0 / fVar33) * fVar25;
  fVar29 = (1.0 / fVar33) * fVar29;
  fVar30 = (fVar29 + fVar25) * 0.5;
  fVar23 = fVar25;
  fVar32 = fVar29;
  fVar31 = fVar25;
  fVar33 = fVar29;
  fVar35 = fVar39;
  fVar36 = fVar34;
  fVar37 = fVar39;
  fVar38 = fVar34;
  local_48 = fVar39;
  fStack_44 = fVar34;
  fStack_40 = fVar39;
  fStack_3c = fVar34;
  local_38 = fVar25;
  fStack_34 = fVar29;
  fStack_30 = fVar25;
  fStack_2c = fVar29;
  for (; pNVar18 != (NSVGshape *)0x0; pNVar18 = pNVar18->next) {
    fVar10 = pNVar18->bounds[1];
    fVar11 = pNVar18->bounds[2];
    fVar12 = pNVar18->bounds[3];
    pNVar18->bounds[0] = (pNVar18->bounds[0] + fVar35) * fVar23;
    pNVar18->bounds[1] = (fVar10 + fVar36) * fVar32;
    pNVar18->bounds[2] = (fVar11 + fVar37) * fVar31;
    pNVar18->bounds[3] = (fVar12 + fVar38) * fVar33;
    ppNVar14 = &pNVar18->paths;
    while (pNVar7 = *ppNVar14, pNVar7 != (NSVGpath *)0x0) {
      fVar10 = pNVar7->bounds[1];
      fVar11 = pNVar7->bounds[2];
      fVar12 = pNVar7->bounds[3];
      pNVar7->bounds[0] = (pNVar7->bounds[0] + fVar35) * fVar23;
      pNVar7->bounds[1] = (fVar10 + fVar36) * fVar32;
      pNVar7->bounds[2] = (fVar11 + fVar37) * fVar31;
      pNVar7->bounds[3] = (fVar12 + fVar38) * fVar33;
      uVar16 = (ulong)(uint)pNVar7->npts;
      if (pNVar7->npts < 1) {
        uVar16 = 0;
      }
      for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
        uVar3 = *(undefined8 *)(pNVar7->pts + uVar17 * 2);
        *(ulong *)(pNVar7->pts + uVar17 * 2) =
             CONCAT44(((float)((ulong)uVar3 >> 0x20) + fVar34) * fVar29,
                      ((float)uVar3 + fVar39) * fVar25);
      }
      ppNVar14 = &pNVar7->next;
    }
    if (((pNVar18->fill).type & 0xfeU) == 2) {
      nsvg__scaleGradient((pNVar18->fill).field_1.gradient,fVar39,fVar34,fVar25,fVar29);
      pNVar8 = (pNVar18->fill).field_1.gradient;
      local_58 = *(undefined8 *)(pNVar8->xform + 4);
      local_68 = *(undefined8 *)pNVar8->xform;
      uStack_60 = *(undefined8 *)(pNVar8->xform + 2);
      nsvg__xformInverse(pNVar8->xform,(float *)&local_68);
      fVar23 = local_38;
      fVar32 = fStack_34;
      fVar31 = fStack_30;
      fVar33 = fStack_2c;
      fVar35 = local_48;
      fVar36 = fStack_44;
      fVar37 = fStack_40;
      fVar38 = fStack_3c;
    }
    if (((pNVar18->stroke).type & 0xfeU) == 2) {
      nsvg__scaleGradient((pNVar18->stroke).field_1.gradient,fVar39,fVar34,fVar25,fVar29);
      pNVar8 = (pNVar18->stroke).field_1.gradient;
      local_58 = *(undefined8 *)(pNVar8->xform + 4);
      local_68 = *(undefined8 *)pNVar8->xform;
      uStack_60 = *(undefined8 *)(pNVar8->xform + 2);
      nsvg__xformInverse(pNVar8->xform,(float *)&local_68);
      fVar23 = local_38;
      fVar32 = fStack_34;
      fVar31 = fStack_30;
      fVar33 = fStack_2c;
      fVar35 = local_48;
      fVar36 = fStack_44;
      fVar37 = fStack_40;
      fVar38 = fStack_3c;
    }
    uVar2 = pNVar18->strokeWidth;
    uVar5 = pNVar18->strokeDashOffset;
    pNVar18->strokeWidth = (float)uVar2 * fVar30;
    pNVar18->strokeDashOffset = (float)uVar5 * fVar30;
    bVar6 = pNVar18->strokeDashCount;
    if ((char)bVar6 < '\x01') {
      bVar6 = 0;
    }
    for (uVar16 = 0; bVar6 != uVar16; uVar16 = uVar16 + 1) {
      pNVar18->strokeDashArray[uVar16] = pNVar18->strokeDashArray[uVar16] * fVar30;
    }
  }
  pNVar13 = p->image;
  p->image = (NSVGimage *)0x0;
  nsvg__deletePaths(p->plist);
  __ptr = p->gradients;
  while (__ptr != (NSVGgradientData *)0x0) {
    pNVar9 = __ptr->next;
    free(__ptr->stops);
    free(__ptr);
    __ptr = pNVar9;
  }
  nsvgDelete(p->image);
  free(p->pts);
  free(p);
  return pNVar13;
}

Assistant:

NSVGimage* nsvgParse(char* input, const char* units, float dpi)
{
	NSVGparser* p;
	NSVGimage* ret = 0;

	p = nsvg__createParser();
	if (p == NULL) {
		return NULL;
	}
	p->dpi = dpi;

	nsvg__parseXML(input, nsvg__startElement, nsvg__endElement, nsvg__content, p);

	// Scale to viewBox
	nsvg__scaleToViewbox(p, units);

	ret = p->image;
	p->image = NULL;

	nsvg__deleteParser(p);

	return ret;
}